

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

value * __thiscall cppcms::json::value::at(value *this,char *cpath)

{
  bool bVar1;
  json_type jVar2;
  undefined8 uVar3;
  bad_value_cast *this_00;
  pointer ppVar4;
  bad_value_cast *in_RSI;
  value *in_RDI;
  iterator p;
  object *obj;
  string_key part;
  size_t new_pos;
  size_t pos;
  value *ptr;
  string_key path;
  map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *in_stack_fffffffffffffe18;
  string_key *in_stack_fffffffffffffe20;
  string_key *in_stack_fffffffffffffe28;
  bad_value_cast *in_stack_fffffffffffffe30;
  iterator in_stack_fffffffffffffe38;
  object *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  size_t in_stack_fffffffffffffe50;
  string_key *in_stack_fffffffffffffe58;
  allocator *paVar5;
  _Self local_108;
  _Base_ptr local_100;
  _Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_> local_f8;
  object *local_f0;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [96];
  string_key *local_58;
  string_key *local_50;
  value *local_48;
  json_type in_stack_ffffffffffffffe0;
  json_type in_stack_ffffffffffffffe4;
  string *in_stack_ffffffffffffffe8;
  
  string_key::unowned((char *)in_stack_fffffffffffffe28);
  local_50 = (string_key *)0x0;
  local_48 = in_RDI;
  while( true ) {
    local_58 = (string_key *)
               string_key::find((string_key *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                (char)((ulong)in_stack_fffffffffffffe40 >> 0x38),
                                (size_t)in_stack_fffffffffffffe38._M_node);
    string_key::unowned_substr
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (local_58 != (string_key *)0xffffffffffffffff) {
      local_58 = (string_key *)((long)&local_58->begin_ + 1);
    }
    bVar1 = string_key::empty(in_stack_fffffffffffffe20);
    if (bVar1) {
      local_ba = 1;
      uVar3 = __cxa_allocate_exception(0x48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"Invalid path provided",&local_b9);
      bad_value_cast::bad_value_cast(in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
      local_ba = 0;
      __cxa_throw(uVar3,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    jVar2 = type((value *)0x3e3b46);
    if (jVar2 != is_object) {
      local_e2 = 1;
      uVar3 = __cxa_allocate_exception(0x48);
      paVar5 = &local_e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"",paVar5);
      type((value *)0x3e3baa);
      bad_value_cast::bad_value_cast
                (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                 in_stack_ffffffffffffffe0);
      local_e2 = 0;
      __cxa_throw(uVar3,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    in_stack_fffffffffffffe40 = object((value *)0x3e3c5e);
    local_f0 = in_stack_fffffffffffffe40;
    std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
    _Rb_tree_iterator(&local_f8);
    in_stack_fffffffffffffe38 =
         std::
         map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
         ::find(in_stack_fffffffffffffe18,(key_type *)0x3e3c94);
    local_100 = in_stack_fffffffffffffe38._M_node;
    local_f8._M_node = in_stack_fffffffffffffe38._M_node;
    local_108._M_node =
         (_Base_ptr)
         std::
         map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
         ::end(in_stack_fffffffffffffe18);
    bVar1 = std::operator==(&local_f8,&local_108);
    if (bVar1) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
             operator->((_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
                         *)0x3e3e2a);
    local_48 = &ppVar4->second;
    local_50 = local_58;
    string_key::~string_key((string_key *)0x3e3e53);
    in_stack_fffffffffffffe20 = local_58;
    in_stack_fffffffffffffe28 = (string_key *)string_key::size(local_58);
    if (in_stack_fffffffffffffe28 <= in_stack_fffffffffffffe20) {
      string_key::~string_key((string_key *)0x3e3ea0);
      return local_48;
    }
  }
  this_00 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  string_key::str_abi_cxx11_(in_stack_fffffffffffffe58);
  std::operator+((char *)in_stack_fffffffffffffe28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  bad_value_cast::bad_value_cast(this_00,(string *)in_stack_fffffffffffffe28);
  __cxa_throw(this_00,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value &value::at(char const *cpath)
	{
		string_key path=string_key::unowned(cpath);
		value *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key part=path.unowned_substr(pos,new_pos - pos);
			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				throw bad_value_cast("Invalid path provided");
			if(ptr->type()!=json::is_object)
				throw bad_value_cast("",ptr->type(),json::is_object);
			json::object &obj=ptr->object();
			json::object::iterator p;
			if((p=obj.find(part))==obj.end())
				throw bad_value_cast("Member "+part.str()+" not found");
			ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		return *ptr;
	}